

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

int MeCab::decode_charset(char *charset)

{
  bool bVar1;
  int iVar2;
  allocator local_29;
  string tmp;
  
  std::__cxx11::string::string((string *)&tmp,charset,&local_29);
  toLower(&tmp);
  bVar1 = std::operator==(&tmp,"sjis");
  iVar2 = 1;
  if (!bVar1) {
    bVar1 = std::operator==(&tmp,"shift-jis");
    if (!bVar1) {
      bVar1 = std::operator==(&tmp,"shift_jis");
      if (!bVar1) {
        bVar1 = std::operator==(&tmp,"cp932");
        if (!bVar1) {
          bVar1 = std::operator==(&tmp,"euc");
          iVar2 = 0;
          if (!bVar1) {
            bVar1 = std::operator==(&tmp,"euc_jp");
            if (!bVar1) {
              bVar1 = std::operator==(&tmp,"euc-jp");
              if (!bVar1) {
                bVar1 = std::operator==(&tmp,"utf8");
                iVar2 = 2;
                if (!bVar1) {
                  bVar1 = std::operator==(&tmp,"utf_8");
                  if (!bVar1) {
                    bVar1 = std::operator==(&tmp,"utf-8");
                    if (!bVar1) {
                      bVar1 = std::operator==(&tmp,"utf16");
                      iVar2 = 3;
                      if (!bVar1) {
                        bVar1 = std::operator==(&tmp,"utf_16");
                        if (!bVar1) {
                          bVar1 = std::operator==(&tmp,"utf-16");
                          if (!bVar1) {
                            bVar1 = std::operator==(&tmp,"utf16be");
                            iVar2 = 5;
                            if (!bVar1) {
                              bVar1 = std::operator==(&tmp,"utf_16be");
                              if (!bVar1) {
                                bVar1 = std::operator==(&tmp,"utf-16be");
                                if (!bVar1) {
                                  bVar1 = std::operator==(&tmp,"utf16le");
                                  iVar2 = 4;
                                  if (!bVar1) {
                                    bVar1 = std::operator==(&tmp,"utf_16le");
                                    if (!bVar1) {
                                      bVar1 = std::operator==(&tmp,"utf-16le");
                                      if (!bVar1) {
                                        bVar1 = std::operator==(&tmp,"ascii");
                                        iVar2 = (uint)bVar1 * 4 + 2;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&tmp);
  return iVar2;
}

Assistant:

int decode_charset(const char *charset) {
  std::string tmp = charset;
  toLower(&tmp);
  if (tmp == "sjis"  || tmp == "shift-jis" ||
      tmp == "shift_jis" || tmp == "cp932")
    return CP932;
  else if (tmp == "euc"   || tmp == "euc_jp" ||
           tmp == "euc-jp")
    return EUC_JP;
  else if (tmp == "utf8" || tmp == "utf_8" ||
           tmp == "utf-8")
    return UTF8;
  else if (tmp == "utf16" || tmp == "utf_16" ||
           tmp == "utf-16")
    return UTF16;
  else if (tmp == "utf16be" || tmp == "utf_16be" ||
           tmp == "utf-16be")
    return UTF16BE;
  else if (tmp == "utf16le" || tmp == "utf_16le" ||
           tmp == "utf-16le")
    return UTF16LE;
  else if (tmp == "ascii")
    return ASCII;

  return UTF8;  // default is UTF8
}